

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

string * __thiscall
ctemplate::TemplateDictionary::CreateSubdictName_abi_cxx11_
          (string *__return_storage_ptr__,TemplateDictionary *this,TemplateString *dict_name,
          TemplateString *sub_name,size_t index,char *suffix)

{
  TemplateString *ts;
  TemplateString *ts_00;
  string sStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  char index_str [64];
  
  snprintf(index_str,0x40,"%lu");
  PrintableTemplateString_abi_cxx11_(&local_88,this,ts);
  std::operator+(&local_108,&local_88,"/");
  PrintableTemplateString_abi_cxx11_(&sStack_128,(TemplateDictionary *)dict_name,ts_00);
  std::operator+(&local_e8,&local_108,&sStack_128);
  std::operator+(&local_c8,&local_e8,"#");
  std::operator+(&local_a8,&local_c8,index_str);
  std::operator+(__return_storage_ptr__,&local_a8,(char *)index);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&sStack_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

string TemplateDictionary::CreateSubdictName(
    const TemplateString& dict_name, const TemplateString& sub_name,
    size_t index, const char* suffix) {
  char index_str[64];
  snprintf(index_str, sizeof(index_str), "%" PRIuS, index);
  return (PrintableTemplateString(dict_name) + "/" +
          PrintableTemplateString(sub_name) + "#" + index_str + suffix);
}